

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

void asmjit::v1_14::ConstPool_addGap(ConstPool *self,size_t offset,size_t size)

{
  Gap *pGVar1;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  Gap *gap;
  size_t gapSize;
  size_t gapIndex;
  char *in_stack_00000370;
  int in_stack_0000037c;
  char *in_stack_00000380;
  ConstPool *in_stack_ffffffffffffff78;
  size_t local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  
  local_68 = in_RDX;
  local_60 = in_RSI;
  if (in_RDX == 0) {
    DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
  }
  while( true ) {
    if (local_68 == 0) {
      return;
    }
    if ((local_68 < 0x20) || (local_60 % 0x20 != 0)) {
      if ((local_68 < 0x10) || (local_60 % 0x10 != 0)) {
        if ((local_68 < 8) || (local_60 % 8 != 0)) {
          if ((local_68 < 4) || (local_60 % 4 != 0)) {
            if ((local_68 < 2) || (local_60 % 2 != 0)) {
              local_70 = 0;
              local_78 = 1;
            }
            else {
              local_70 = 1;
              local_78 = 2;
            }
          }
          else {
            local_70 = 2;
            local_78 = 4;
          }
        }
        else {
          local_70 = 3;
          local_78 = 8;
        }
      }
      else {
        local_70 = 4;
        local_78 = 0x10;
      }
    }
    else {
      local_70 = 5;
      local_78 = 0x20;
    }
    pGVar1 = ConstPool_allocGap(in_stack_ffffffffffffff78);
    if (pGVar1 == (Gap *)0x0) break;
    pGVar1->_next = *(Gap **)(in_RDI + 0xb0 + local_70 * 8);
    *(Gap **)(in_RDI + 0xb0 + local_70 * 8) = pGVar1;
    pGVar1->_offset = local_60;
    pGVar1->_size = local_78;
    local_60 = local_78 + local_60;
    local_68 = local_68 - local_78;
  }
  return;
}

Assistant:

static void ConstPool_addGap(ConstPool* self, size_t offset, size_t size) noexcept {
  ASMJIT_ASSERT(size > 0);

  while (size > 0) {
    size_t gapIndex;
    size_t gapSize;

    if (size >= 32 && Support::isAligned<size_t>(offset, 32)) {
      gapIndex = ConstPool::kIndex32;
      gapSize = 32;
    }
    else if (size >= 16 && Support::isAligned<size_t>(offset, 16)) {
      gapIndex = ConstPool::kIndex16;
      gapSize = 16;
    }
    else if (size >= 8 && Support::isAligned<size_t>(offset, 8)) {
      gapIndex = ConstPool::kIndex8;
      gapSize = 8;
    }
    else if (size >= 4 && Support::isAligned<size_t>(offset, 4)) {
      gapIndex = ConstPool::kIndex4;
      gapSize = 4;
    }
    else if (size >= 2 && Support::isAligned<size_t>(offset, 2)) {
      gapIndex = ConstPool::kIndex2;
      gapSize = 2;
    }
    else {
      gapIndex = ConstPool::kIndex1;
      gapSize = 1;
    }

    // We don't have to check for errors here, if this failed nothing really happened (just the gap won't be
    // visible) and it will fail again at place where the same check would generate `kErrorOutOfMemory` error.
    ConstPool::Gap* gap = ConstPool_allocGap(self);
    if (!gap)
      return;

    gap->_next = self->_gaps[gapIndex];
    self->_gaps[gapIndex] = gap;

    gap->_offset = offset;
    gap->_size = gapSize;

    offset += gapSize;
    size -= gapSize;
  }
}